

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_TIFFPredictor.cc
# Opt level: O1

void __thiscall Pl_TIFFPredictor::processRow(Pl_TIFFPredictor *this)

{
  ulong uVar1;
  byte bVar2;
  pointer puVar3;
  byte *pbVar4;
  ulong *puVar5;
  ulong *puVar6;
  ulong uVar7;
  Pipeline *pPVar8;
  uchar *p;
  long *plVar9;
  long lVar10;
  longlong lVar11;
  char cVar12;
  uint uVar13;
  ulong uVar14;
  long val;
  longlong *prev;
  long *plVar15;
  byte *pbVar16;
  bool bVar17;
  BitStream in;
  BitWriter bw;
  BitStream local_70;
  BitWriter local_48;
  
  local_70.start = (uchar *)0x0;
  std::vector<long_long,_std::allocator<long_long>_>::_M_fill_assign
            (&this->previous,(ulong)this->samples_per_pixel,(value_type_conflict2 *)&local_70);
  if (this->bits_per_sample == 8) {
    puVar3 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar3;
    }
    pbVar16 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pbVar4 = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pbVar16 != pbVar4) {
      puVar5 = (ulong *)(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
      do {
        puVar6 = (ulong *)(this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
        if (puVar6 != puVar5) {
          do {
            bVar2 = *pbVar16;
            uVar7 = *puVar6;
            bVar17 = this->action == a_encode;
            uVar1 = uVar7 + bVar2;
            uVar14 = uVar1;
            if (bVar17) {
              uVar14 = (ulong)bVar2;
            }
            *puVar6 = uVar14;
            cVar12 = (char)uVar1;
            if (bVar17) {
              cVar12 = bVar2 - (char)uVar7;
            }
            local_70.start = (uchar *)CONCAT71(local_70.start._1_7_,cVar12);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (&this->out,(uchar *)&local_70);
            pbVar16 = pbVar16 + 1;
          } while ((puVar6 + 1 != puVar5) && (puVar6 = puVar6 + 1, pbVar16 != pbVar4));
        }
      } while (pbVar16 != pbVar4);
    }
    pPVar8 = (this->super_Pipeline).next_;
    puVar3 = (this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    (*pPVar8->_vptr_Pipeline[2])
              (pPVar8,puVar3,
               (long)(this->out).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
  }
  else {
    BitWriter::BitWriter(&local_48,(this->super_Pipeline).next_);
    p = (this->cur_row).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
    BitStream::BitStream
              (&local_70,p,
               (long)(this->cur_row).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)p);
    if (this->columns != 0) {
      uVar13 = 0;
      do {
        plVar9 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (plVar15 = (this->previous).super__Vector_base<long_long,_std::allocator<long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start; plVar15 != plVar9;
            plVar15 = plVar15 + 1) {
          lVar11 = BitStream::getBitsSigned(&local_70,(ulong)this->bits_per_sample);
          val = *plVar15 + lVar11;
          lVar10 = val;
          if (this->action == a_encode) {
            val = lVar11 - *plVar15;
            lVar10 = lVar11;
          }
          *plVar15 = lVar10;
          BitWriter::writeBitsSigned(&local_48,val,(ulong)this->bits_per_sample);
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < this->columns);
    }
    BitWriter::flush(&local_48);
  }
  return;
}

Assistant:

void
Pl_TIFFPredictor::processRow()
{
    QTC::TC("libtests", "Pl_TIFFPredictor processRow", (action == a_decode ? 0 : 1));
    previous.assign(samples_per_pixel, 0);
    if (bits_per_sample != 8) {
        BitWriter bw(next());
        BitStream in(cur_row.data(), cur_row.size());
        for (unsigned int col = 0; col < this->columns; ++col) {
            for (auto& prev: previous) {
                long long sample = in.getBitsSigned(this->bits_per_sample);
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= prev;
                    prev = sample;
                } else {
                    new_sample += prev;
                    prev = new_sample;
                }
                bw.writeBitsSigned(new_sample, this->bits_per_sample);
            }
        }
        bw.flush();
    } else {
        out.clear();
        auto next_it = cur_row.begin();
        auto cr_end = cur_row.end();
        auto pr_end = previous.end();

        while (next_it != cr_end) {
            for (auto prev = previous.begin(); prev != pr_end && next_it != cr_end;
                 ++prev, ++next_it) {
                long long sample = *next_it;
                long long new_sample = sample;
                if (action == a_encode) {
                    new_sample -= *prev;
                    *prev = sample;
                } else {
                    new_sample += *prev;
                    *prev = new_sample;
                }
                out.push_back(static_cast<unsigned char>(255U & new_sample));
            }
        }
        next()->write(out.data(), out.size());
    }
}